

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall
capnp::SchemaLoader::Validator::validate(Validator *this,Reader *structNode,uint64_t scopeId)

{
  void *pvVar1;
  bool bVar2;
  WirePointer *pWVar3;
  StructPointerCount SVar4;
  ListElementCount LVar5;
  int iVar6;
  undefined4 uVar7;
  unsigned_short *puVar8;
  uint uVar9;
  ulong uVar10;
  ushort uVar11;
  uint uVar12;
  ulong uVar13;
  SegmentReader *pSVar14;
  uint64_t id;
  Validator *pVVar15;
  size_t __n;
  ElementCount index;
  undefined1 *puVar16;
  bool bVar17;
  bool fieldIsPointer;
  uint dataSizeInBits;
  uint pointerCount;
  uint fieldBits;
  Reader field;
  Array<bool> sawDiscriminantValue_heap;
  Array<bool> sawCodeOrder_heap;
  anon_class_8_1_a7e8901a _kjContextFunc338;
  Fault f;
  Fault f_3;
  Reader fields;
  bool sawDiscriminantValue_stack [32];
  bool sawCodeOrder_stack [32];
  bool local_265;
  uint local_264;
  int local_260;
  uint local_25c;
  ulong local_258;
  uint local_24c;
  ulong local_248;
  anon_class_8_1_6f242a07 local_240;
  StructReader local_238;
  undefined1 *local_208;
  ulong uStack_200;
  undefined8 *local_1f8;
  undefined1 *local_1e8;
  ulong uStack_1e0;
  undefined8 *local_1d8;
  ushort *local_1d0;
  uint local_1c8;
  ElementCount local_1c4;
  uint64_t local_1c0;
  Reader *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  size_t local_1a0;
  Validator *local_198;
  ulong local_190;
  Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
  *local_188;
  StructReader *local_180;
  PointerReader local_178;
  ArrayPtr<const_char> local_158;
  WirePointer *local_148;
  int local_140;
  undefined1 local_128 [24];
  int local_110;
  StructReader **local_e0;
  ArrayPtr<const_char> local_d8;
  WirePointer *local_c8;
  int local_c0;
  ListReader local_a8;
  undefined1 local_78 [32];
  undefined1 local_58 [40];
  
  uVar12 = (structNode->_reader).dataSize;
  local_24c = 0;
  local_25c = 0;
  if (0x7f < uVar12) {
    local_25c = (uint)*(ushort *)((long)(structNode->_reader).data + 0xe) << 6;
  }
  if (0xcf < uVar12) {
    local_24c = (uint)*(ushort *)((long)(structNode->_reader).data + 0x18);
  }
  if ((structNode->_reader).pointerCount < 4) {
    local_110 = 0x7fffffff;
    local_128._8_8_ = (ExceptionCallback *)0x0;
    local_128._16_8_ = (WirePointer *)0x0;
    local_128._0_8_ = (Exception *)0x0;
  }
  else {
    local_128._0_8_ = (structNode->_reader).segment;
    local_128._8_8_ = (structNode->_reader).capTable;
    local_128._16_8_ = (structNode->_reader).pointers + 3;
    local_110 = (structNode->_reader).nestingLimit;
  }
  local_1c0 = scopeId;
  capnp::_::PointerReader::getList
            (&local_a8,(PointerReader *)local_128,INLINE_COMPOSITE,(word *)0x0);
  LVar5 = local_a8.elementCount;
  uVar13 = (ulong)local_a8.elementCount;
  if (uVar13 < 0x21) {
    local_1e8 = (undefined1 *)0x0;
    uStack_1e0 = 0;
    local_1d8 = (undefined8 *)0x0;
  }
  else {
    local_1e8 = (undefined1 *)
                kj::_::HeapArrayDisposer::allocateImpl
                          (1,uVar13,uVar13,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_1d8 = &kj::_::HeapArrayDisposer::instance;
    uStack_1e0 = uVar13;
  }
  __n = uStack_1e0;
  puVar16 = local_1e8;
  if (LVar5 < 0x21) {
    __n = uVar13;
    puVar16 = local_58;
  }
  uVar11 = 0;
  memset(puVar16,0,__n);
  if (0xff < (structNode->_reader).dataSize) {
    uVar11 = *(ushort *)((long)(structNode->_reader).data + 0x1e);
  }
  uVar13 = (ulong)uVar11;
  if (uVar11 < 0x21) {
    local_208 = (undefined1 *)0x0;
    uStack_200 = 0;
    local_1f8 = (undefined8 *)0x0;
    local_1b0 = local_78;
  }
  else {
    local_1b0 = (undefined1 *)
                kj::_::HeapArrayDisposer::allocateImpl
                          (1,uVar13,uVar13,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_1f8 = &kj::_::HeapArrayDisposer::instance;
    local_208 = local_1b0;
    uStack_200 = uVar13;
  }
  local_190 = uVar13;
  memset(local_1b0,0,uVar13);
  uVar12 = (structNode->_reader).dataSize;
  if ((0xff < uVar12) && (*(short *)((long)(structNode->_reader).data + 0x1e) != 0)) {
    uVar9 = 0;
    if (0xff < uVar12) {
      if (*(short *)((long)(structNode->_reader).data + 0x1e) == 1) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
                  ((Fault *)local_128,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x143,FAILED,"structNode.getDiscriminantCount() != 1",
                   "\"union must have at least two members\"",
                   (char (*) [37])"union must have at least two members");
        this->isValid = false;
        kj::_::Debug::Fault::~Fault((Fault *)local_128);
        goto LAB_00402ab5;
      }
      if (0xff < uVar12) {
        uVar9 = (uint)*(ushort *)((long)(structNode->_reader).data + 0x1e);
      }
    }
    if (local_a8.elementCount < uVar9) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[54]>
                ((Fault *)local_128,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x145,FAILED,"structNode.getDiscriminantCount() <= fields.size()",
                 "\"struct can\'t have more union fields than total fields\"",
                 (char (*) [54])"struct can\'t have more union fields than total fields");
      this->isValid = false;
      kj::_::Debug::Fault::~Fault((Fault *)local_128);
      goto LAB_00402ab5;
    }
    uVar9 = 0x10;
    if (0x11f < uVar12) {
      uVar9 = *(int *)((long)(structNode->_reader).data + 0x20) * 0x10 + 0x10;
    }
    if (local_25c < uVar9) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36]>
                ((Fault *)local_128,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x148,FAILED,"(structNode.getDiscriminantOffset() + 1) * 16 <= dataSizeInBits",
                 "\"union discriminant is out-of-bounds\"",
                 (char (*) [36])"union discriminant is out-of-bounds");
      this->isValid = false;
      kj::_::Debug::Fault::~Fault((Fault *)local_128);
      goto LAB_00402ab5;
    }
  }
  uVar13 = (ulong)local_a8.elementCount;
  puVar8 = (unsigned_short *)kj::Arena::allocateBytes(&this->loader->arena,uVar13 * 2,2,false);
  (this->membersByDiscriminant).ptr = puVar8;
  (this->membersByDiscriminant).size_ = uVar13;
  uVar13 = 0;
  if (0xff < (structNode->_reader).dataSize) {
    uVar13 = (ulong)*(ushort *)((long)(structNode->_reader).data + 0x1e);
  }
  local_1c4 = local_a8.elementCount;
  bVar17 = local_a8.elementCount == 0;
  if (bVar17) {
    local_248 = 0;
  }
  else {
    local_188 = (Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
                 *)&this->members;
    local_248 = 0;
    local_260 = 0;
    local_264 = 0;
    index = 0;
    local_1b8 = structNode;
    local_1a8 = puVar16;
    local_1a0 = __n;
    local_198 = this;
    do {
      capnp::_::ListReader::getStructElement(&local_238,&local_a8,index);
      local_258 = uVar13;
      local_180 = &local_238;
      kj::_::Debug::Context::Context((Context *)local_128);
      uVar13 = local_258;
      local_128._0_8_ = &PTR__Context_00649f30;
      local_e0 = &local_180;
      local_d8.size_ = (size_t)local_238.capTable;
      local_c8 = local_238.pointers;
      local_d8.ptr = (char *)local_238.segment;
      local_c0 = local_238.nestingLimit;
      if (local_238.pointerCount == 0) {
        local_d8.size_ = (size_t)(Validator *)0x0;
        local_c8 = (WirePointer *)0x0;
        local_d8.ptr = (char *)(SegmentReader *)0x0;
        local_c0 = 0x7fffffff;
      }
      local_158 = (ArrayPtr<const_char>)
                  capnp::_::PointerReader::getBlob<capnp::Text>
                            ((PointerReader *)&local_d8,(void *)0x0,0);
      local_178.segment = (SegmentReader *)&local_158;
      local_c8 = (WirePointer *)CONCAT44(local_c8._4_4_,local_260);
      local_240.update = (anon_class_16_2_3f8e8a0c *)&local_178;
      local_178.capTable = (CapTableReader *)this;
      local_d8 = local_158;
      kj::
      Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
      ::
      upsert<kj::TreeMap<capnp::Text::Reader,unsigned_int>::upsert<capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_>(capnp::Text::Reader,unsigned_int,capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_&&)::_lambda(kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&,kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&&)_1_>
                (local_188,(Entry *)&local_d8,&local_240);
      iVar6 = local_238.nestingLimit;
      SVar4 = local_238.pointerCount;
      pWVar3 = local_238.pointers;
      pVVar15 = (Validator *)local_238.capTable;
      pSVar14 = local_238.segment;
      if (local_238.dataSize < 0x10) {
        uVar10 = 0;
      }
      else {
        uVar10 = (ulong)*local_238.data;
      }
      if (uVar10 < __n) {
        if (local_238.dataSize < 0x10) {
          uVar10 = 0;
        }
        else {
          uVar10 = (ulong)*local_238.data;
        }
        if (local_1a8[uVar10] != '\0') goto LAB_0040288c;
        if (local_238.dataSize < 0x10) {
          uVar10 = 0;
        }
        else {
          uVar10 = (ulong)*local_238.data;
        }
        local_1a8[uVar10] = 1;
        if ((0x5f < local_238.dataSize) && (*(ushort *)((long)local_238.data + 10) == 1)) {
          uVar12 = 0;
          if (0x6f < local_238.dataSize) {
            uVar12 = (uint)*(ushort *)((long)local_238.data + 0xc);
          }
          if (local_264 <= uVar12) {
            local_264 = 1;
            if (0x6f < local_238.dataSize) {
              local_264 = *(ushort *)((long)local_238.data + 0xc) + 1;
            }
            goto LAB_004025d1;
          }
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[35]>
                    ((Fault *)&local_d8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x15d,FAILED,"ordinal.getExplicit() >= nextOrdinal",
                     "\"fields were not ordered by ordinal\"",
                     (char (*) [35])"fields were not ordered by ordinal");
          this->isValid = false;
          kj::_::Debug::Fault::~Fault((Fault *)&local_d8);
          goto LAB_00402a20;
        }
LAB_004025d1:
        if ((0x1f < local_238.dataSize) && (*(ushort *)((long)local_238.data + 2) != 0)) {
          uVar10 = 0xffff;
          if (0x1f < local_238.dataSize) {
            uVar10 = (ulong)*(ushort *)((long)local_238.data + 2) ^ 0xffff;
          }
          if (uVar10 < local_190) {
            uVar10 = 0xffff;
            if (0x1f < local_238.dataSize) {
              uVar10 = (ulong)*(ushort *)((long)local_238.data + 2) ^ 0xffff;
            }
            if (local_1b0[uVar10] != '\x01') {
              uVar10 = 0xffff;
              if (0x1f < local_238.dataSize) {
                uVar10 = (ulong)*(ushort *)((long)local_238.data + 2) ^ 0xffff;
              }
              local_1b0[uVar10] = 1;
              uVar12 = (uint)local_248;
              local_248 = (ulong)(uVar12 + 1);
              goto LAB_00402670;
            }
          }
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
                    ((Fault *)&local_d8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x164,FAILED,
                     "field.getDiscriminantValue() < sawDiscriminantValue.size() && !sawDiscriminantValue[field.getDiscriminantValue()]"
                     ,"\"invalid discriminantValue\"",(char (*) [26])"invalid discriminantValue");
          this->isValid = false;
          kj::_::Debug::Fault::~Fault((Fault *)&local_d8);
          goto LAB_00402a20;
        }
        uVar12 = (uint)uVar13;
        if (local_a8.elementCount < uVar12) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
                    ((Fault *)&local_d8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x16a,FAILED,"nonDiscriminantPos <= fields.size()",
                     "\"discriminantCount did not match fields\"",
                     (char (*) [39])"discriminantCount did not match fields");
          this->isValid = false;
          kj::_::Debug::Fault::~Fault((Fault *)&local_d8);
          goto LAB_00402a20;
        }
        uVar13 = (ulong)(uVar12 + 1);
LAB_00402670:
        (this->membersByDiscriminant).ptr[uVar12] = (unsigned_short)local_260;
        if (local_238.dataSize < 0x50) {
          uVar11 = 0;
        }
        else {
          uVar11 = *(ushort *)((long)local_238.data + 8);
        }
        local_258 = uVar13;
        if (uVar11 == 1) {
          if (local_238.dataSize < 0xc0) {
            id = 0;
          }
          else {
            id = *(uint64_t *)((long)local_238.data + 0x10);
          }
          validateTypeId(this,id,STRUCT);
        }
        else if (uVar11 == 0) {
          local_1d0 = (ushort *)local_238.data;
          local_1c8 = local_238.dataSize;
          local_240.update = local_240.update & 0xffffffff00000000;
          local_265 = false;
          if (local_238.pointerCount < 3) {
            local_140 = 0x7fffffff;
            local_158.size_ = 0;
            local_148 = (WirePointer *)0x0;
            local_158.ptr = (char *)0x0;
          }
          else {
            local_148 = local_238.pointers + 2;
            local_158.size_ = (size_t)local_238.capTable;
            local_158.ptr = (char *)local_238.segment;
            local_140 = local_238.nestingLimit;
          }
          capnp::_::PointerReader::getStruct
                    ((StructReader *)&local_d8,(PointerReader *)&local_158,(word *)0x0);
          if (SVar4 < 4) {
            iVar6 = 0x7fffffff;
            pVVar15 = (Validator *)0x0;
            local_178.pointer = (WirePointer *)0x0;
            pSVar14 = (SegmentReader *)0x0;
          }
          else {
            local_178.pointer = pWVar3 + 3;
          }
          local_178.segment = pSVar14;
          local_178.capTable = (CapTableReader *)pVVar15;
          local_178.nestingLimit = iVar6;
          capnp::_::PointerReader::getStruct((StructReader *)&local_158,&local_178,(word *)0x0);
          this = local_198;
          validate(local_198,(Reader *)&local_d8,(Reader *)&local_158,(uint *)&local_240,&local_265)
          ;
          __n = local_1a0;
          iVar6 = 1;
          if (0x3f < local_1c8) {
            iVar6 = *(int *)(local_1d0 + 2) + 1;
          }
          if (local_25c < (uint)(iVar6 * (int)local_240.update)) {
            bVar2 = false;
          }
          else {
            iVar6 = 1;
            if (0x3f < local_1c8) {
              iVar6 = *(int *)(local_1d0 + 2) + 1;
            }
            bVar2 = (uint)local_265 * iVar6 <= local_24c;
          }
          structNode = local_1b8;
          if (!bVar2) {
            uVar7 = 0;
            if (0x3f < local_1c8) {
              uVar7 = *(undefined4 *)(local_1d0 + 2);
            }
            local_158.ptr._0_4_ = uVar7;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,char_const(&)[27],unsigned_int,unsigned_int&,unsigned_int&>
                      ((Fault *)&local_d8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                       ,0x178,FAILED,
                       "fieldBits * (slot.getOffset() + 1) <= dataSizeInBits && fieldIsPointer * (slot.getOffset() + 1) <= pointerCount"
                       ,
                       "\"field offset out-of-bounds\", slot.getOffset(), dataSizeInBits, pointerCount"
                       ,(char (*) [27])"field offset out-of-bounds",(uint *)&local_158,&local_25c,
                       &local_24c);
            this->isValid = false;
            kj::_::Debug::Fault::~Fault((Fault *)&local_d8);
            structNode = local_1b8;
            goto LAB_00402a20;
          }
        }
        local_260 = local_260 + 1;
        bVar2 = true;
      }
      else {
LAB_0040288c:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[18]>
                  ((Fault *)&local_d8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x157,FAILED,
                   "field.getCodeOrder() < sawCodeOrder.size() && !sawCodeOrder[field.getCodeOrder()]"
                   ,"\"invalid codeOrder\"",(char (*) [18])"invalid codeOrder");
        this->isValid = false;
        kj::_::Debug::Fault::~Fault((Fault *)&local_d8);
LAB_00402a20:
        bVar2 = false;
      }
      kj::_::Debug::Context::~Context((Context *)local_128);
      uVar13 = local_258;
      if (!bVar2) break;
      index = index + 1;
      bVar17 = local_1c4 == index;
    } while (!bVar17);
  }
  if (bVar17) {
    uVar12 = (structNode->_reader).dataSize;
    uVar9 = 0;
    if (0xff < uVar12) {
      uVar9 = (uint)*(ushort *)((long)(structNode->_reader).data + 0x1e);
    }
    if ((uint)local_248 != uVar9) {
      local_238.segment = (SegmentReader *)0x0;
      local_128._0_8_ = (Exception *)0x0;
      local_128._8_8_ = (ExceptionCallback *)0x0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_238,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_238);
    }
    if ((ElementCount)uVar13 != local_a8.elementCount) {
      local_238.segment = (SegmentReader *)0x0;
      local_128._0_8_ = (Exception *)0x0;
      local_128._8_8_ = (ExceptionCallback *)0x0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_238,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_238);
    }
    if ((0xe0 < uVar12) && ((*(byte *)((long)(structNode->_reader).data + 0x1c) & 1) != 0)) {
      if (local_1c0 == 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[27]>
                  ((Fault *)local_128,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x18b,FAILED,"scopeId != 0","\"group node missing scopeId\"",
                   (char (*) [27])"group node missing scopeId");
        this->isValid = false;
        kj::_::Debug::Fault::~Fault((Fault *)local_128);
      }
      else {
        pvVar1 = (structNode->_reader).data;
        SchemaLoader::Impl::requireStructSize
                  (this->loader,local_1c0,(uint)*(ushort *)((long)pvVar1 + 0xe),
                   (uint)*(ushort *)((long)pvVar1 + 0x18));
        validateTypeId(this,local_1c0,STRUCT);
      }
    }
  }
LAB_00402ab5:
  uVar13 = uStack_200;
  puVar16 = local_208;
  if (local_208 != (undefined1 *)0x0) {
    local_208 = (undefined1 *)0x0;
    uStack_200 = 0;
    (**(code **)*local_1f8)(local_1f8,puVar16,1,uVar13,uVar13,0);
  }
  uVar13 = uStack_1e0;
  puVar16 = local_1e8;
  if (local_1e8 != (undefined1 *)0x0) {
    local_1e8 = (undefined1 *)0x0;
    uStack_1e0 = 0;
    (**(code **)*local_1d8)(local_1d8,puVar16,1,uVar13,uVar13,0);
  }
  return;
}

Assistant:

void validate(const schema::Node::Struct::Reader& structNode, uint64_t scopeId) {
    uint dataSizeInBits = structNode.getDataWordCount() * 64;
    uint pointerCount = structNode.getPointerCount();

    auto fields = structNode.getFields();

    KJ_STACK_ARRAY(bool, sawCodeOrder, fields.size(), 32, 256);
    memset(sawCodeOrder.begin(), 0, sawCodeOrder.size() * sizeof(sawCodeOrder[0]));

    KJ_STACK_ARRAY(bool, sawDiscriminantValue, structNode.getDiscriminantCount(), 32, 256);
    memset(sawDiscriminantValue.begin(), 0,
           sawDiscriminantValue.size() * sizeof(sawDiscriminantValue[0]));

    if (structNode.getDiscriminantCount() > 0) {
      VALIDATE_SCHEMA(structNode.getDiscriminantCount() != 1,
                      "union must have at least two members");
      VALIDATE_SCHEMA(structNode.getDiscriminantCount() <= fields.size(),
                      "struct can't have more union fields than total fields");

      VALIDATE_SCHEMA((structNode.getDiscriminantOffset() + 1) * 16 <= dataSizeInBits,
                      "union discriminant is out-of-bounds");
    }